

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SnapshotManager.hpp
# Opt level: O2

void __thiscall OpenMD::SnapshotManager::~SnapshotManager(SnapshotManager *this)

{
  Snapshot *pSVar1;
  
  this->_vptr_SnapshotManager = (_func_int **)&PTR__SnapshotManager_00285358;
  pSVar1 = this->currentSnapshot_;
  if (pSVar1 != (Snapshot *)0x0) {
    Snapshot::~Snapshot(pSVar1);
  }
  operator_delete(pSVar1,0xa98);
  pSVar1 = this->previousSnapshot_;
  if (pSVar1 != (Snapshot *)0x0) {
    Snapshot::~Snapshot(pSVar1);
  }
  operator_delete(pSVar1,0xa98);
  return;
}

Assistant:

virtual ~SnapshotManager() {
      delete currentSnapshot_;
      delete previousSnapshot_;
    }